

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  internal *this;
  TestResult *result;
  TestInfo *pTVar6;
  int width;
  int width_00;
  int width_01;
  TimeInMillis ms;
  string local_210;
  int local_1f0;
  byte local_1e9;
  int i;
  bool comma;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  string kIndent;
  allocator local_39;
  undefined1 local_38 [8];
  string kTestsuite;
  TestSuite *test_suite_local;
  ostream *stream_local;
  
  kTestsuite.field_2._8_8_ = test_suite;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"testsuite",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  Indent_abi_cxx11_((string *)local_70,(internal *)0x6,width);
  Indent_abi_cxx11_(&local_90,(internal *)0x4,width_00);
  poVar4 = std::operator<<(stream,(string *)&local_90);
  std::operator<<(poVar4,"{\n");
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"name",&local_b1);
  pcVar5 = TestSuite::name((TestSuite *)kTestsuite.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,pcVar5,&local_d9);
  OutputJsonKey(stream,(string *)local_38,&local_b0,&local_d8,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"tests",&local_101);
  iVar2 = TestSuite::reportable_test_count((TestSuite *)kTestsuite.field_2._8_8_);
  OutputJsonKey(stream,(string *)local_38,&local_100,iVar2,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"failures",&local_129);
    iVar2 = TestSuite::failed_test_count((TestSuite *)kTestsuite.field_2._8_8_);
    OutputJsonKey(stream,(string *)local_38,&local_128,iVar2,(string *)local_70,true);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,"disabled",&local_151);
    iVar2 = TestSuite::reportable_disabled_test_count((TestSuite *)kTestsuite.field_2._8_8_);
    OutputJsonKey(stream,(string *)local_38,&local_150,iVar2,(string *)local_70,true);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_178,"errors",&local_179);
    OutputJsonKey(stream,(string *)local_38,&local_178,0,(string *)local_70,true);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a0,"time",&local_1a1);
    this = (internal *)TestSuite::elapsed_time((TestSuite *)kTestsuite.field_2._8_8_);
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_1c8,this,ms);
    OutputJsonKey(stream,(string *)local_38,&local_1a0,&local_1c8,(string *)local_70,false);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    result = TestSuite::ad_hoc_test_result((TestSuite *)kTestsuite.field_2._8_8_);
    TestPropertiesAsJson((string *)&i,result,(string *)local_70);
    poVar4 = std::operator<<(stream,(string *)&i);
    std::operator<<(poVar4,",\n");
    std::__cxx11::string::~string((string *)&i);
  }
  poVar4 = std::operator<<(stream,(string *)local_70);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,(string *)local_38);
  std::operator<<(poVar4,"\": [\n");
  local_1e9 = 0;
  for (local_1f0 = 0; iVar2 = local_1f0,
      iVar3 = TestSuite::total_test_count((TestSuite *)kTestsuite.field_2._8_8_), iVar2 < iVar3;
      local_1f0 = local_1f0 + 1) {
    pTVar6 = TestSuite::GetTestInfo((TestSuite *)kTestsuite.field_2._8_8_,local_1f0);
    bVar1 = TestInfo::is_reportable(pTVar6);
    if (bVar1) {
      if ((local_1e9 & 1) == 0) {
        local_1e9 = 1;
      }
      else {
        std::operator<<(stream,",\n");
      }
      pcVar5 = TestSuite::name((TestSuite *)kTestsuite.field_2._8_8_);
      pTVar6 = TestSuite::GetTestInfo((TestSuite *)kTestsuite.field_2._8_8_,local_1f0);
      OutputJsonTestInfo(stream,pcVar5,pTVar6);
    }
  }
  poVar4 = std::operator<<(stream,"\n");
  poVar4 = std::operator<<(poVar4,(string *)local_70);
  poVar4 = std::operator<<(poVar4,"]\n");
  Indent_abi_cxx11_(&local_210,(internal *)0x4,width_01);
  poVar4 = std::operator<<(poVar4,(string *)&local_210);
  std::operator<<(poVar4,"}");
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestSuite(
    std::ostream* stream, const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  const std::string kIndent = Indent(6);

  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_suite.name(), kIndent);
  OutputJsonKey(stream, kTestsuite, "tests", test_suite.reportable_test_count(),
                kIndent);
  if (!GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "failures",
                  test_suite.failed_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "disabled",
                  test_suite.reportable_disabled_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "errors", 0, kIndent);
    OutputJsonKey(stream, kTestsuite, "time",
                  FormatTimeInMillisAsDuration(test_suite.elapsed_time()),
                  kIndent, false);
    *stream << TestPropertiesAsJson(test_suite.ad_hoc_test_result(), kIndent)
            << ",\n";
  }

  *stream << kIndent << "\"" << kTestsuite << "\": [\n";

  bool comma = false;
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable()) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      OutputJsonTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
    }
  }
  *stream << "\n" << kIndent << "]\n" << Indent(4) << "}";
}